

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/catch.hpp:9743:35)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adamfowleruk[P]groundupdb_groundupdb_tests_catch_hpp:9743:35)>
          *this,string *arg)

{
  string *in_RCX;
  string *arg_local;
  BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adamfowleruk[P]groundupdb_groundupdb_tests_catch_hpp:9743:35)>
  *this_local;
  
  invokeLambda<std::__cxx11::string,Catch::makeCommandLineParser(Catch::ConfigData&)::__7>
            (__return_storage_ptr__,(detail *)&this->m_lambda,
             (anon_class_8_1_50637480_for_m_lambda *)arg,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }